

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

BYTE Lowerer::GetArrayIndirScale(ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  undefined4 *puVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_c [4];
  ValueType valueType_local;
  
  local_c[0] = valueType.field_0;
  bVar2 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_c[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3b60,"(valueType.IsLikelyAnyOptimizedArray())",
                       "valueType.IsLikelyAnyOptimizedArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_c[0].field_0);
  if (bVar2) {
    bVar2 = ValueType::HasIntElements((ValueType *)&local_c[0].field_0);
    if (bVar2) {
      return '\x02';
    }
    bVar2 = ValueType::HasFloatElements((ValueType *)&local_c[0].field_0);
    if (bVar2) {
      return '\x03';
    }
  }
  OVar3 = ValueType::GetObjectType((ValueType *)&local_c[0].field_0);
  return IndirScales[OVar3];
}

Assistant:

BYTE Lowerer::GetArrayIndirScale(const ValueType valueType)
{
    Assert(valueType.IsLikelyAnyOptimizedArray());
    if(valueType.IsLikelyArrayOrObjectWithArray())
    {
        if(valueType.HasIntElements())
        {
            return 2; // log2(sizeof(int32))
        }
        else if(valueType.HasFloatElements())
        {
            return 3; // log2(sizeof(double))
        }
    }

    return IndirScales[static_cast<ValueType::TSize>(valueType.GetObjectType())];
}